

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void getDWPTCoeffs(wpt_object wt,int X,int Y,double *coeffs,int N)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  char *__format;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  uVar3 = (ulong)(uint)wt->J;
  if ((X < 1) || (wt->J < X)) {
    __format = "X co-ordinate must be >= 1 and <= %d";
  }
  else {
    iVar5 = 1;
    iVar6 = X;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      iVar5 = iVar5 * 2;
    }
    if ((-1 < Y) && (Y < iVar5)) {
      iVar6 = 0;
      iVar5 = 0;
      for (; X < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
        iVar1 = wt->numnodeslevel[uVar3];
        iVar6 = iVar6 + iVar1;
        iVar5 = iVar5 + iVar1 * wt->coeflength[uVar3];
      }
      iVar1 = wt->numnodeslevel[(uint)X];
      lVar4 = (long)iVar6;
      iVar6 = 0;
      if (0 < iVar1) {
        iVar6 = iVar1;
      }
      while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
        if (wt->nodeindex[lVar4 * 2 + 1] == Y) {
          uVar2 = 0;
          uVar3 = (ulong)(uint)N;
          if (N < 1) {
            uVar3 = 0;
          }
          for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
            coeffs[uVar2] = wt->output[(long)iVar5 + uVar2];
          }
          return;
        }
        lVar4 = lVar4 + 1;
        iVar5 = iVar5 + wt->coeflength[(uint)X];
      }
      puts(
          "The Node is Not Part Of The Best Basis Tree Use wpt_summary function to list available nodes "
          );
      goto LAB_00104f58;
    }
    __format = "Y co-ordinate must be >= 0 and <= %d";
    uVar3 = (ulong)(iVar5 - 1);
  }
  printf(__format,uVar3);
LAB_00104f58:
  exit(-1);
}

Assistant:

void getDWPTCoeffs(wpt_object wt, int X, int Y, double *coeffs, int N) {
	int ymax, i;
	int np,citer;
	int flag;

	if (X <= 0 || X > wt->J) {
		printf("X co-ordinate must be >= 1 and <= %d", wt->J);
		exit(-1);
	}
	ymax = 1;
	for (i = 0; i < X; ++i) {
		ymax *= 2;
	}

	ymax -= 1;

	if (Y < 0 || Y > ymax) {
		printf("Y co-ordinate must be >= 0 and <= %d", ymax);
		exit(-1);
	}

	np = 0;
	citer = 0;

	for (i = wt->J; i > X; --i) {
		np += wt->numnodeslevel[i];
		citer += wt->numnodeslevel[i] * wt->coeflength[i];
	}

	i = 0;
	flag = 0;
	for (i = 0; i < wt->numnodeslevel[X]; ++i) {
		if (wt->nodeindex[2 * np + 1] == Y) {
			flag = 1;
			break;
		}
		np++;
		citer += wt->coeflength[X];
	}

	if (flag == 0) {
		printf("The Node is Not Part Of The Best Basis Tree Use wpt_summary function to list available nodes \n");
		exit(-1);
	}

	for (i = 0; i < N; ++i) {
		coeffs[i] = wt->output[citer + i];
	}

}